

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlb.c
# Opt level: O1

boolean lib_dlb_fopen(dlb *dp,char *name,char *mode)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  library *plVar4;
  long *plVar5;
  int i;
  long lVar6;
  
  lVar6 = 0;
  while( true ) {
    bVar1 = true;
    if (dlb_libs[lVar6].fdata == (FILE *)0x0) break;
    plVar4 = dlb_libs + lVar6;
    lVar3 = dlb_libs[lVar6].nentries;
    if (0 < lVar3) {
      plVar5 = &(dlb_libs[lVar6].dir)->fsize;
      do {
        iVar2 = strcmp(name,((libdir *)(plVar5 + -2))->fname);
        if (iVar2 == 0) {
          lVar6 = plVar5[-1];
          lVar3 = *plVar5;
          bVar1 = false;
          goto LAB_00102fc8;
        }
        plVar5 = plVar5 + 4;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    lVar6 = lVar6 + 1;
    if (lVar6 == 4) break;
  }
  lVar3 = 0;
  plVar4 = (library *)0x0;
  lVar6 = 0;
LAB_00102fc8:
  if (!bVar1) {
    dp->lib = plVar4;
    dp->start = lVar6;
    dp->size = lVar3;
    dp->mark = 0;
  }
  return !bVar1;
}

Assistant:

static boolean lib_dlb_fopen(dlb *dp, const char *name, const char *mode)
{
    long start, size;
    library *lp;

    /* look up file in directory */
    if (find_file(name, &lp, &start, &size)) {
	dp->lib = lp;
	dp->start = start;
	dp->size = size;
	dp->mark = 0;
	return TRUE;
	}

    return FALSE;	/* failed */
}